

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O0

double StrToD(char *str,int flags,double empty_string_value,int *processed_characters_count,
             bool *processed_all,uc16 separator)

{
  int iVar1;
  size_t sVar2;
  undefined8 in_RCX;
  uint *in_RDX;
  int in_ESI;
  char *in_RDI;
  uc16 in_R8W;
  char *in_XMM0_Qa;
  double dVar3;
  char *expected_source;
  double result16;
  bool processed_all16;
  int processed_characters_count16;
  int i;
  int len;
  uc16 buffer16 [256];
  double result;
  StringToDoubleConverter converter;
  undefined4 in_stack_fffffffffffffd68;
  char *buffer;
  StringToDoubleConverter *in_stack_fffffffffffffd80;
  int in_stack_fffffffffffffd8c;
  int iVar4;
  short local_268 [11];
  uc16 in_stack_fffffffffffffdae;
  bool *in_stack_fffffffffffffdb0;
  int *in_stack_fffffffffffffdb8;
  double in_stack_fffffffffffffdc0;
  int in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  uc16 *in_stack_fffffffffffffdd0;
  StringToDoubleConverter local_60;
  uc16 local_2a;
  undefined8 local_28;
  uint *local_20;
  char *local_8;
  
  local_2a = in_R8W;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_8 = in_RDI;
  dVar3 = double_conversion::Double::NaN();
  double_conversion::StringToDoubleConverter::StringToDoubleConverter
            (&local_60,in_ESI,(double)in_XMM0_Qa,dVar3,(char *)0x0,(char *)0x0,local_2a);
  buffer = local_8;
  strlen(local_8);
  dVar3 = double_conversion::StringToDoubleConverter::StringToDouble
                    (in_stack_fffffffffffffd80,buffer,(int)((ulong)in_XMM0_Qa >> 0x20),
                     (int *)CONCAT44(in_ESI,in_stack_fffffffffffffd68));
  sVar2 = strlen(local_8);
  *(bool *)local_28 = sVar2 == *local_20;
  sVar2 = strlen(local_8);
  iVar1 = (int)sVar2;
  for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
    local_268[iVar4] = (short)local_8[iVar4];
  }
  expected_source =
       (char *)StrToD16(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc,
                        in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                        in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                        in_stack_fffffffffffffdae);
  CheckEqualsHelper((char *)CONCAT44(iVar1,iVar4),in_stack_fffffffffffffd8c,expected_source,
                    (double)buffer,in_XMM0_Qa,(double)CONCAT44(in_ESI,in_stack_fffffffffffffd68));
  CheckEqualsHelper((char *)CONCAT44(iVar1,iVar4),in_stack_fffffffffffffd8c,expected_source,
                    (int)((ulong)buffer >> 0x20),in_XMM0_Qa,in_ESI);
  return dVar3;
}

Assistant:

static double StrToD(const char* str, int flags, double empty_string_value,
                     int* processed_characters_count, bool* processed_all,
                     uc16 separator = StringToDoubleConverter::kNoSeparator) {
  StringToDoubleConverter converter(flags, empty_string_value, Double::NaN(),
                                    NULL, NULL, separator);
  double result = converter.StringToDouble(str, strlen(str),
                                           processed_characters_count);
  *processed_all =
      ((strlen(str) == static_cast<unsigned>(*processed_characters_count)));

  uc16 buffer16[256];
  DOUBLE_CONVERSION_ASSERT(strlen(str) < DOUBLE_CONVERSION_ARRAY_SIZE(buffer16));
  int len = strlen(str);
  for (int i = 0; i < len; i++) {
    buffer16[i] = str[i];
  }
  int processed_characters_count16;
  bool processed_all16;
  double result16 = StrToD16(buffer16, len, flags, empty_string_value,
                             &processed_characters_count16, &processed_all16,
                             separator);
  CHECK_EQ(result, result16);
  CHECK_EQ(*processed_characters_count, processed_characters_count16);
  return result;
}